

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall Thread::Thread(Thread *this)

{
  __shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->_vptr_Thread = (_func_int **)&PTR__Thread_001b56c0;
  this->mAutoDelete = false;
  (this->mMutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->mMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mMutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  this->mRunning = false;
  EventLoop::eventLoop();
  std::__weak_ptr<EventLoop,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<EventLoop,void>
            ((__weak_ptr<EventLoop,(__gnu_cxx::_Lock_policy)2> *)&this->mLoop,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

Thread::Thread()
    : mAutoDelete(false), mRunning(false), mLoop(EventLoop::eventLoop())
{
}